

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  MessageBuilder builder;
  StringRef local_b8 [2];
  undefined1 local_98 [96];
  SourceLineInfo local_38;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00571e20;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  Totals::Totals(&this->totals,_totals);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    local_b8[0].m_start = (this->assertionResult).m_info.macroName.m_start;
    local_b8[0].m_size = (this->assertionResult).m_info.macroName.m_size;
    local_38.file = (this->assertionResult).m_info.lineInfo.file;
    local_38.line = (this->assertionResult).m_info.lineInfo.line;
    MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_98,local_b8,&local_38,
               (this->assertionResult).m_resultData.resultType);
    std::__cxx11::string::string((string *)local_b8,(string *)&(this->assertionResult).m_resultData)
    ;
    std::operator<<((ostream *)local_98._16_8_,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)(local_98 + 0x28),(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)(local_98 + 0x18));
    MessageBuilder::~MessageBuilder((MessageBuilder *)local_98);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }